

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Model * gvr::createModelFromContours(char *name,double scale,double height)

{
  Image *pIVar1;
  Mesh *this;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> pl;
  ImageU8 image;
  
  image.depth = 0;
  image.width = 0;
  image.height = 0;
  image.n = 0;
  image.pixel = (uchar *)0x0;
  image.row = (uchar **)0x0;
  image.img = (uchar ***)0x0;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&image,0,0,1);
  pIVar1 = (Image *)gimage::getImageIO();
  gimage::ImageIO::load(pIVar1,(char *)&image,(int)name,1,0,0,-1);
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pl.super__Vector_base<gimage::Polygon,_std::allocator<gimage::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gimage::extractContours((vector *)&pl,(Image *)&image,0.25);
  this = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(this);
  createMeshFromContours(this,&pl,scale,height);
  std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::~vector(&pl);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&image);
  return (Model *)this;
}

Assistant:

Model *createModelFromContours(const char *name, double scale, double height)
{
  // load image

  gimage::ImageU8 image;
  gimage::getImageIO().load(image, name);

  // extract contours

  std::vector<gimage::Polygon> pl;
  extractContours(pl, image, 0.25f);

  // create mesh from contours

  Mesh *mesh=new Mesh();

  try
  {
    createMeshFromContours(mesh, pl, scale, height);
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  return mesh;
}